

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O0

bool __thiscall
S2MinDistanceShapeIndexTarget::UpdateMinDistance
          (S2MinDistanceShapeIndexTarget *this,S2Cell *cell,S2MinDistance *min_dist)

{
  bool bVar1;
  undefined1 local_60 [8];
  CellTarget target;
  S2MinDistance *min_dist_local;
  S2Cell *cell_local;
  S2MinDistanceShapeIndexTarget *this_local;
  
  target.super_S2MinDistanceCellTarget.cell_.uv_.bounds_[1].bounds_.c_[1] = (VType)min_dist;
  S2ClosestEdgeQuery::CellTarget::CellTarget((CellTarget *)local_60,cell);
  bVar1 = UpdateMinDistance(this,(S2MinDistanceTarget *)local_60,
                            (S2MinDistance *)
                            target.super_S2MinDistanceCellTarget.cell_.uv_.bounds_[1].bounds_.c_[1])
  ;
  S2ClosestEdgeQuery::CellTarget::~CellTarget((CellTarget *)local_60);
  return bVar1;
}

Assistant:

bool S2MinDistanceShapeIndexTarget::UpdateMinDistance(
    const S2Cell& cell, S2MinDistance* min_dist) {
  S2ClosestEdgeQuery::CellTarget target(cell);
  return UpdateMinDistance(&target, min_dist);
}